

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

void __thiscall aeron::ClientConductor::releaseCounter(ClientConductor *this,int64_t registrationId)

{
  pointer pCVar1;
  pointer pCVar2;
  int iVar3;
  pointer pCVar4;
  long lVar5;
  iterator __position;
  
  verifyDriverIsActiveViaErrorHandler(this);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pCVar1 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = ((long)pCVar2 - (long)pCVar1 >> 5) * -0x5555555555555555 >> 2;
  pCVar4 = pCVar1;
  if (0 < lVar5) {
    pCVar4 = pCVar1 + lVar5 * 4;
    lVar5 = lVar5 + 1;
    __position._M_current = pCVar1 + 2;
    do {
      if (__position._M_current[-2].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -2;
        goto LAB_001406e4;
      }
      if (__position._M_current[-1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -1;
        goto LAB_001406e4;
      }
      if ((__position._M_current)->m_registrationId == registrationId) goto LAB_001406e4;
      if (__position._M_current[1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + 1;
        goto LAB_001406e4;
      }
      lVar5 = lVar5 + -1;
      __position._M_current = __position._M_current + 4;
    } while (1 < lVar5);
  }
  lVar5 = ((long)pCVar2 - (long)pCVar4 >> 5) * -0x5555555555555555;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      __position._M_current = pCVar2;
      if ((lVar5 != 3) ||
         (__position._M_current = pCVar4, pCVar4->m_registrationId == registrationId))
      goto LAB_001406e4;
      pCVar4 = pCVar4 + 1;
    }
    __position._M_current = pCVar4;
    if (pCVar4->m_registrationId == registrationId) goto LAB_001406e4;
    pCVar4 = pCVar4 + 1;
  }
  __position._M_current = pCVar4;
  if (pCVar4->m_registrationId != registrationId) {
    __position._M_current = pCVar2;
  }
LAB_001406e4:
  if (__position._M_current != pCVar2) {
    DriverProxy::removeCounter(this->m_driverProxy,(__position._M_current)->m_registrationId);
    std::
    vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
    ::_M_erase(&this->m_counters,__position);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::releaseCounter(std::int64_t registrationId)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(
        m_counters.begin(),
        m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it != m_counters.end())
    {
        m_driverProxy.removeCounter((*it).m_registrationId);

        m_counters.erase(it);
    }
}